

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O1

StandardNeeded __thiscall
anon_unknown.dwarf_82960e::StandardLevelComputer::HighestStandardNeeded
          (StandardLevelComputer *this,cmMakefile *makefile,string *feature)

{
  pointer pbVar1;
  cmValue cVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  long lVar4;
  ulong uVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  string prefix;
  uint local_bc;
  ulong local_b8;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  size_type local_90;
  pointer local_88;
  undefined8 local_80;
  char *local_78;
  string local_70;
  string local_50;
  
  local_88 = (this->Language)._M_dataplus._M_p;
  local_90 = (this->Language)._M_string_length;
  local_a0._M_len = 6;
  local_a0._M_str = "CMAKE_";
  views._M_len = 2;
  views._M_array = &local_a0;
  cmCatViews_abi_cxx11_(&local_50,views);
  if ((this->Levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      (this->Levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    local_b8 = 0xffffffff00000000;
    uVar5 = 0xffffffff;
  }
  else {
    local_b8 = 0xffffffff;
    lVar4 = 8;
    uVar5 = 0;
    local_bc = 0xffffffff;
    do {
      pbVar1 = (this->LevelsAsStrings).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_88 = *(pointer *)((long)pbVar1 + lVar4 + -8);
      local_90 = *(size_type *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4);
      local_a0._M_len = local_50._M_string_length;
      local_a0._M_str = local_50._M_dataplus._M_p;
      local_80 = 0x11;
      local_78 = "_COMPILE_FEATURES";
      views_00._M_len = 3;
      views_00._M_array = &local_a0;
      cmCatViews_abi_cxx11_(&local_70,views_00);
      cVar2 = cmMakefile::GetDefinition(makefile,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (cVar2.Value != (string *)0x0) {
        arg._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
        arg._M_len = (cVar2.Value)->_M_string_length;
        cmExpandedList_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_a0,arg,false);
        _Var3 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_a0._M_len,local_a0._M_str,feature);
        if (_Var3._M_current !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._M_str) {
          local_b8 = (ulong)(uint)(this->Levels).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar5];
          local_bc = (uint)uVar5;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_a0);
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar5 < (ulong)((long)(this->Levels).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->Levels).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 2));
    local_b8 = local_b8 << 0x20;
    uVar5 = (ulong)local_bc;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return (StandardNeeded)(local_b8 | uVar5);
}

Assistant:

StandardNeeded HighestStandardNeeded(cmMakefile* makefile,
                                       std::string const& feature) const
  {
    std::string prefix = cmStrCat("CMAKE_", this->Language);
    StandardNeeded maxLevel = { -1, -1 };
    for (size_t i = 0; i < this->Levels.size(); ++i) {
      if (cmValue prop = makefile->GetDefinition(
            cmStrCat(prefix, this->LevelsAsStrings[i], "_COMPILE_FEATURES"))) {
        std::vector<std::string> props = cmExpandedList(*prop);
        if (cm::contains(props, feature)) {
          maxLevel = { static_cast<int>(i), this->Levels[i] };
        }
      }
    }
    return maxLevel;
  }